

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O2

int __thiscall foxxll::ufs_file_base::unlink(ufs_file_base *this,char *__name)

{
  int extraout_EAX;
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  string sStack_1a8;
  ostringstream msg;
  
  if (this->is_device_ == true) {
    tlx::Logger::Logger((Logger *)&msg);
    std::operator<<((ostream *)&msg,"unlink() path=");
    std::operator<<((ostream *)&msg,(string *)&this->filename_);
    std::operator<<((ostream *)&msg," skipped as file is device node");
    tlx::Logger::~Logger((Logger *)&msg);
    iVar1 = extraout_EAX;
  }
  else {
    iVar1 = ::unlink((this->filename_)._M_dataplus._M_p);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar2 = std::operator<<((ostream *)&msg,"Error in ");
      poVar2 = std::operator<<(poVar2,"void foxxll::ufs_file_base::unlink()");
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,"unlink() path=");
      poVar2 = std::operator<<(poVar2,(string *)&this->filename_);
      poVar2 = std::operator<<(poVar2," fd=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->file_des_);
      poVar2 = std::operator<<(poVar2," : ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      io_error::io_error(this_00,&sStack_1a8);
      __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  return iVar1;
}

Assistant:

void ufs_file_base::unlink()
{
    if (is_device_) {
        TLX_LOG1 << "unlink() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::unlink(filename_.c_str()) != 0)
        FOXXLL_THROW_ERRNO(io_error, "unlink() path=" << filename_ << " fd=" << file_des_);
}